

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTupleArray<unsigned_long,2ul>
          (AsciiParser *this,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
          *result)

{
  bool bVar1;
  undefined8 in_RAX;
  char c;
  
  c = (char)((ulong)in_RAX >> 0x38);
  bVar1 = Expect(this,'[');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    bVar1 = Char1(this,&c);
    if (!bVar1) {
      return bVar1;
    }
    if (c == ']') {
      if (*(long *)(result + 8) == *(long *)result) {
        return bVar1;
      }
      *(long *)(result + 8) = *(long *)result;
      return bVar1;
    }
    Rewind(this,1);
    bVar1 = SepBy1TupleType<unsigned_long,2ul>(this,',',result);
    if (bVar1) {
      bVar1 = Expect(this,']');
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseTupleArray(
    std::vector<nonstd::optional<std::array<T, N>>> *result) {

  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1TupleType<T, N>(',', result)) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }

  return true;
}